

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O1

void anon_unknown.dwarf_1e45e::storeLevel
               (TiledOutputPart *out,ChannelList *channels,int lx,int ly,Image *image)

{
  int iVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  ImageChannel *pIVar4;
  int iVar5;
  int x;
  int y;
  int iVar6;
  FrameBuffer fb;
  allocator<char> local_d1;
  _Rb_tree_node_base *local_d0;
  Image *local_c8;
  ChannelList *local_c0;
  string local_b8;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_98;
  undefined1 local_68 [56];
  
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8 = image;
  local_c0 = channels;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d0 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  while( true ) {
    p_Var3 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (local_d0 == p_Var3) break;
    p_Var3 = local_d0 + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,(char *)p_Var3,&local_d1)
    ;
    pIVar4 = Image::channel(local_c8,&local_b8);
    (*pIVar4->_vptr_ImageChannel[2])(local_68,pIVar4);
    Imf_3_2::FrameBuffer::insert((char *)&local_98,(Slice *)p_Var3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_d0 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_d0);
  }
  Imf_3_2::TiledOutputPart::setFrameBuffer((FrameBuffer *)out);
  iVar6 = 0;
  while( true ) {
    iVar5 = (int)out;
    iVar1 = Imf_3_2::TiledOutputPart::numYTiles(iVar5);
    if (iVar1 <= iVar6) break;
    iVar1 = 0;
    while( true ) {
      iVar2 = Imf_3_2::TiledOutputPart::numXTiles(iVar5);
      if (iVar2 <= iVar1) break;
      Imf_3_2::TiledOutputPart::writeTile(iVar5,iVar1,iVar6,lx);
      iVar1 = iVar1 + 1;
    }
    iVar6 = iVar6 + 1;
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree(&local_98);
  return;
}

Assistant:

void
storeLevel (
    TiledOutputPart&   out,
    const ChannelList& channels,
    int                lx,
    int                ly,
    const Image&       image)
{
    //
    // Store the pixels for level (lx, ly) in output file out.
    //

    FrameBuffer fb;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        const char* name = i.name ();
        fb.insert (name, image.channel (name).slice ());
    }

    out.setFrameBuffer (fb);

    for (int y = 0; y < out.numYTiles (ly); ++y)
        for (int x = 0; x < out.numXTiles (lx); ++x)
            out.writeTile (x, y, lx, ly);
}